

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

Float modelQuantization(Float value,PixelFormat format)

{
  undefined1 auVar1 [16];
  int in_EDI;
  float in_XMM0_Da;
  char *in_stack_00000088;
  int in_stack_00000094;
  char *in_stack_00000098;
  LogLevel in_stack_000000a4;
  Half local_e [5];
  float local_4;
  
  if (in_EDI == 0) {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),ZEXT416((uint)in_XMM0_Da),
                             SUB6416(ZEXT464(0x3f000000),0));
    local_4 = pbrt::Clamp<float,int,int>(auVar1._0_4_,0,0xff);
    local_4 = local_4 * 0.003921569;
  }
  else if (in_EDI == 1) {
    pbrt::Half::Half(local_e,in_XMM0_Da);
    local_4 = pbrt::Half::operator_cast_to_float(local_e);
  }
  else {
    local_4 = in_XMM0_Da;
    if (in_EDI != 2) {
      pbrt::LogFatal(in_stack_000000a4,in_stack_00000098,in_stack_00000094,in_stack_00000088);
    }
  }
  return local_4;
}

Assistant:

static Float modelQuantization(Float value, PixelFormat format) {
    switch (format) {
    case PixelFormat::U256:
        return Clamp((value * 255.f) + 0.5f, 0, 255) * (1.f / 255.f);
    case PixelFormat::Half:
        return Float(Half(value));
    case PixelFormat::Float:
        return value;
    default:
        LOG_FATAL("Unhandled pixel format");
    }
}